

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_address.cpp
# Opt level: O2

CreatePegoutAddressResponseStruct *
cfd::js::api::ElementsAddressStructApi::CreatePegoutAddress
          (CreatePegoutAddressResponseStruct *__return_storage_ptr__,
          CreatePegoutAddressRequestStruct *request)

{
  string *in_R8;
  allocator local_139;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  function<cfd::js::api::CreatePegoutAddressResponseStruct_(const_cfd::js::api::CreatePegoutAddressRequestStruct_&)>
  local_118;
  CreatePegoutAddressResponseStruct local_f8;
  
  CreatePegoutAddressResponseStruct::CreatePegoutAddressResponseStruct(__return_storage_ptr__);
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = std::
              _Function_handler<cfd::js::api::CreatePegoutAddressResponseStruct_(const_cfd::js::api::CreatePegoutAddressRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_address.cpp:230:20)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<cfd::js::api::CreatePegoutAddressResponseStruct_(const_cfd::js::api::CreatePegoutAddressRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_address.cpp:230:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_118,"CreatePegoutAddress",&local_139);
  ExecuteStructApi<cfd::js::api::CreatePegoutAddressRequestStruct,cfd::js::api::CreatePegoutAddressResponseStruct>
            (&local_f8,(api *)request,(CreatePegoutAddressRequestStruct *)&local_138,&local_118,
             in_R8);
  CreatePegoutAddressResponseStruct::operator=(__return_storage_ptr__,&local_f8);
  CreatePegoutAddressResponseStruct::~CreatePegoutAddressResponseStruct(&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::_Function_base::~_Function_base((_Function_base *)&local_138);
  return __return_storage_ptr__;
}

Assistant:

CreatePegoutAddressResponseStruct
ElementsAddressStructApi::CreatePegoutAddress(
    const CreatePegoutAddressRequestStruct& request) {
  auto call_func = [](const CreatePegoutAddressRequestStruct& request)
      -> CreatePegoutAddressResponseStruct {  // NOLINT
    CreatePegoutAddressResponseStruct response;
    NetType mainchain_net_type =
        AddressStructApi::ConvertNetType(request.network);
    NetType elements_net_type =
        ConvertElementsNetType(request.elements_network);
    AddressType addr_type =
        AddressApiBase::ConvertAddressType(request.hash_type);
    Descriptor desc;
    auto addr = ElementsAddressFactory::CreatePegOutAddress(
        mainchain_net_type, elements_net_type, request.descriptor,
        request.bip32_counter, addr_type, &desc);
    response.mainchain_address = addr.GetAddress();
    response.base_descriptor = desc.ToString(false);
    return response;
  };

  CreatePegoutAddressResponseStruct result;
  result = ExecuteStructApi<
      CreatePegoutAddressRequestStruct, CreatePegoutAddressResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}